

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O0

string * __thiscall
Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship_abi_cxx11_
          (string *__return_storage_ptr__,D3MFOpcPackage *this,IOStream *stream)

{
  pointer *this_00;
  bool bVar1;
  CIrrXML_IOStreamReader *this_01;
  pointer callback;
  IrrXMLReader *__p;
  pointer xmlReader;
  DeadlyImportError *this_02;
  __shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_03;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
  local_80 [2];
  shared_ptr<Assimp::D3MF::OpcPackageRelationship> *local_70;
  shared_ptr<Assimp::D3MF::OpcPackageRelationship> *local_68;
  __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
  local_60;
  __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
  itr;
  OpcPackageRelationshipReader reader;
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  xml;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  local_28;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  xmlStream;
  IOStream *stream_local;
  D3MFOpcPackage *this_local;
  
  xmlStream._M_t.
  super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>,_true,_true>
        )(__uniq_ptr_data<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>,_true,_true>
          )stream;
  this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
            (this_01,(IOStream *)
                     xmlStream._M_t.
                     super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                     .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
  unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
            ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
              *)&local_28,this_01);
  callback = std::
             unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
             ::get(&local_28);
  __p = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
  this_00 = &reader.m_relationShips.
             super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
  ::unique_ptr<std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>,void>
            ((unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
              *)this_00,__p);
  xmlReader = std::
              unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
              ::get((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                     *)this_00);
  OpcPackageRelationshipReader::OpcPackageRelationshipReader
            ((OpcPackageRelationshipReader *)&itr,xmlReader);
  local_68 = (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)
             std::
             vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
             ::begin((vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                      *)&itr);
  local_70 = (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)
             std::
             vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
             ::end((vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                    *)&itr);
  local_60 = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>*,std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>>>>,Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
                       (local_68,local_70);
  local_80[0]._M_current =
       (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)
       std::
       vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
       ::end((vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
              *)&itr);
  bVar1 = __gnu_cxx::operator==(&local_60,local_80);
  if (!bVar1) {
    this_03 = (__shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
                 ::operator*(&local_60);
    peVar2 = std::
             __shared_ptr_access<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_03);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar2->target);
    OpcPackageRelationshipReader::~OpcPackageRelationshipReader
              ((OpcPackageRelationshipReader *)&itr);
    std::
    unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
    ::~unique_ptr((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                   *)&reader.m_relationShips.
                      super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ::~unique_ptr(&local_28);
    return __return_storage_ptr__;
  }
  this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a0,"Cannot find ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE_abi_cxx11_);
  DeadlyImportError::DeadlyImportError(this_02,&local_a0);
  __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

std::string D3MFOpcPackage::ReadPackageRootRelationship(IOStream* stream) {
    std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(stream));
    std::unique_ptr<XmlReader> xml(irr::io::createIrrXMLReader(xmlStream.get()));

    OpcPackageRelationshipReader reader(xml.get());

    auto itr = std::find_if(reader.m_relationShips.begin(), reader.m_relationShips.end(), [](const OpcPackageRelationshipPtr& rel){
        return rel->type == XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE;
    });

    if ( itr == reader.m_relationShips.end() ) {
        throw DeadlyImportError( "Cannot find " + XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE );
    }

    return (*itr)->target;
}